

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyMemory.cpp
# Opt level: O0

void Js::WebAssemblyMemory::CheckLimits(ScriptContext *scriptContext,uint32 initial,uint32 maximum)

{
  uint32 uVar1;
  uint32 maximum_local;
  uint32 initial_local;
  ScriptContext *scriptContext_local;
  
  if (maximum < initial) {
    JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ebf6,(PCWSTR)0x0);
  }
  uVar1 = Wasm::Limits::GetMaxMemoryInitialPages();
  if (uVar1 < initial) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec37,L"descriptor.initial");
  }
  uVar1 = Wasm::Limits::GetMaxMemoryMaximumPages();
  if (uVar1 < maximum) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec37,L"descriptor.maximum");
  }
  return;
}

Assistant:

void WebAssemblyMemory::CheckLimits(ScriptContext * scriptContext, uint32 initial, uint32 maximum)
{
    if (maximum < initial)
    {
        JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange);
    }
    if (initial > Wasm::Limits::GetMaxMemoryInitialPages())
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_Invalid, _u("descriptor.initial"));
    }
    if (maximum > Wasm::Limits::GetMaxMemoryMaximumPages())
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_Invalid, _u("descriptor.maximum"));
    }
}